

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChFunction_Recorder.h
# Opt level: O2

void __thiscall chrono::ChRecPoint::ArchiveOUT(ChRecPoint *this,ChArchiveOut *marchive)

{
  ChNameValue<double> local_60;
  ChNameValue<double> local_48;
  ChNameValue<double> local_30;
  
  local_30._name = "x";
  local_30._flags = '\0';
  local_30._value = &this->x;
  ChArchiveOut::operator<<(marchive,&local_30);
  local_48._value = &this->y;
  local_48._name = "y";
  local_48._flags = '\0';
  ChArchiveOut::operator<<(marchive,&local_48);
  local_60._value = &this->w;
  local_60._name = "w";
  local_60._flags = '\0';
  ChArchiveOut::operator<<(marchive,&local_60);
  return;
}

Assistant:

void ArchiveOUT(ChArchiveOut& marchive) {
        marchive << CHNVP(x);
        marchive << CHNVP(y);
        marchive << CHNVP(w);
    }